

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_set(lua_State *L)

{
  undefined8 uVar1;
  GCstr *pGVar2;
  GCstr *str;
  CTState *cts;
  TValue *pTStack_a0;
  MSize len;
  char *p;
  GCobj *ref;
  SBufExt *sbx;
  lua_State *L_local;
  SBufExt *local_78;
  ulong local_70;
  uint64_t local_68;
  char *local_60;
  CTState *local_58;
  CTState *cts_1;
  undefined4 local_44;
  CTState *local_40;
  uint local_34;
  TValue *local_30;
  GCobj *local_28;
  SBufExt *local_20;
  undefined4 local_14;
  CTState *local_10;
  
  sbx = (SBufExt *)L;
  ref = (GCobj *)buffer_tobuf(L);
  if ((int)((long)*(undefined8 *)((long)sbx->field_4 + 8) >> 0x2f) == -0xb) {
    cts_1 = (CTState *)sbx;
    local_58 = *(CTState **)(sbx->b + 0x180);
    local_58->L = (lua_State *)sbx;
    local_44 = 0x12;
    local_14 = 0x12;
    local_40 = local_58;
    local_10 = local_58;
    lj_cconv_ct_tv(local_58,local_58->tab + 0x12,(uint8_t *)&stack0xffffffffffffff60,
                   (TValue *)((long)sbx->field_4 + 8),0x200);
    cts._4_4_ = lj_lib_checkintrange((lua_State *)sbx,3,0,0x7fffff00);
  }
  else {
    pGVar2 = lj_lib_checkstrx((lua_State *)sbx,2);
    pTStack_a0 = (TValue *)(pGVar2 + 1);
    cts._4_4_ = pGVar2->len;
  }
  local_78 = sbx;
  L_local = &ref->th;
  if (((ref->gch).gclist.gcptr64 & 6) == 0) {
    local_60 = sbx->b;
    local_68 = (ref->gch).env.gcptr64;
    uVar1._0_1_ = *(uint8_t *)((long)ref + 8);
    uVar1._1_1_ = *(uint8_t *)((long)ref + 9);
    uVar1._2_1_ = *(uint8_t *)((long)ref + 10);
    uVar1._3_1_ = *(uint8_t *)((long)ref + 0xb);
    uVar1._4_4_ = *(undefined4 *)((long)ref + 0xc);
    local_70 = (ulong)(uint)((int)uVar1 - (int)(ref->gch).env.gcptr64);
    *(ulong *)(local_60 + 0x10) = *(long *)(local_60 + 0x10) - local_70;
    (**(code **)local_60)(*(undefined8 *)(local_60 + 8),local_68,local_70,0);
  }
  (L_local->gclist).gcptr64 = (uint64_t)((long)&local_78->w + 1);
  L_local->base = (TValue *)0x0;
  L_local->marked = '\0';
  L_local->gct = '\0';
  L_local->dummy_ffid = '\0';
  L_local->status = '\0';
  *(undefined4 *)&L_local->field_0xc = 0;
  (L_local->glref).ptr64 = 0;
  (L_local->nextgc).gcptr64 = 0;
  L_local->top = (TValue *)0x0;
  local_20 = sbx;
  local_28 = ref;
  local_30 = pTStack_a0;
  local_34 = cts._4_4_;
  (ref->gch).gclist.gcptr64 = (uint64_t)((long)&sbx->w + 3);
  (ref->gch).env.gcptr64 = (uint64_t)pTStack_a0;
  (ref->th).top = pTStack_a0;
  *(ulong *)&(ref->gch).marked = (long)pTStack_a0 + (ulong)cts._4_4_;
  (ref->gch).nextgc.gcptr64 = (long)pTStack_a0 + (ulong)cts._4_4_;
  p = (char *)(*(ulong *)((long)sbx->field_4 + 8) & 0x7fffffffffff);
  (ref->th).base = (TValue *)p;
  if (((((GChead *)p)->marked & 3) != 0) &&
     ((undefined1  [112])((undefined1  [112])*ref & (undefined1  [112])0x4) !=
      (undefined1  [112])0x0)) {
    lj_gc_barrierf((global_State *)sbx->b,(GCobj *)((long)ref + -0x30),(GCobj *)p);
  }
  sbx->r = (char *)((long)sbx->field_4 + 8);
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_set)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  GCobj *ref;
  const char *p;
  MSize len;
#if LJ_HASFFI
  if (tviscdata(L->base+1)) {
    CTState *cts = ctype_cts(L);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p,
		   L->base+1, CCF_ARG(2));
    len = (MSize)lj_lib_checkintrange(L, 3, 0, LJ_MAX_BUF);
  } else
#endif
  {
    GCstr *str = lj_lib_checkstrx(L, 2);
    p = strdata(str);
    len = str->len;
  }
  lj_bufx_free(L, sbx);
  lj_bufx_set_cow(L, sbx, p, len);
  ref = gcV(L->base+1);
  setgcref(sbx->cowref, ref);
  lj_gc_objbarrier(L, buffer_toudata(sbx), ref);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}